

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

float Gia_ManEvaluateSwitching(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  long lVar2;
  float local_14;
  
  if (p->pSwitching == (uchar *)0x0) {
    __assert_fail("p->pSwitching",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                  ,0x2d4,"float Gia_ManEvaluateSwitching(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  local_14 = 0.0;
  lVar2 = 0;
  while( true ) {
    if (p->nObjs <= lVar2) {
      return local_14;
    }
    pObj = Gia_ManObj(p,(int)lVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    local_14 = local_14 + ((float)p->pSwitching[lVar2] * (float)p->pRefs[iVar1]) / 255.0;
    lVar2 = lVar2 + 1;
  }
  return local_14;
}

Assistant:

float Gia_ManEvaluateSwitching( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    float SwitchTotal = 0.0;
    int i;
    assert( p->pSwitching );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachObj( p, pObj, i )
        SwitchTotal += (float)Gia_ObjRefNum(p, pObj) * p->pSwitching[i] / 255;
    return SwitchTotal;
}